

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSolution.cpp
# Opt level: O0

void __thiscall HighsBasis::print(HighsBasis *this,string *message)

{
  size_type sVar1;
  const_reference pvVar2;
  string *in_RSI;
  long in_RDI;
  HighsInt iRow;
  HighsInt iCol;
  undefined4 in_stack_ffffffffffffff98;
  uint uVar3;
  undefined4 in_stack_ffffffffffffff9c;
  HighsBasis *this_00;
  uint local_44;
  uint local_40;
  
  if ((*(byte *)(in_RDI + 2) & 1) != 0) {
    this_00 = (HighsBasis *)&stack0xffffffffffffffd0;
    std::__cxx11::string::string((string *)this_00,in_RSI);
    printScalars(this_00,(string *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
    std::__cxx11::string::~string((string *)&stack0xffffffffffffffd0);
    local_40 = 0;
    while (uVar3 = local_40,
          sVar1 = std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::size
                            ((vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_> *)
                             (in_RDI + 0x30)), (int)uVar3 < (int)sVar1) {
      uVar3 = local_40;
      pvVar2 = std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::operator[]
                         ((vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_> *)
                          (in_RDI + 0x30),(long)(int)local_40);
      printf("Basis: col_status[%2d] = %d\n",(ulong)uVar3,(ulong)*pvVar2);
      local_40 = local_40 + 1;
    }
    for (local_44 = 0;
        sVar1 = std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::size
                          ((vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_> *)
                           (in_RDI + 0x48)), (int)local_44 < (int)sVar1; local_44 = local_44 + 1) {
      pvVar2 = std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::operator[]
                         ((vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_> *)
                          (in_RDI + 0x48),(long)(int)local_44);
      printf("Basis: row_status[%2d] = %d\n",(ulong)local_44,(ulong)*pvVar2);
    }
  }
  return;
}

Assistant:

void HighsBasis::print(std::string message) const {
  if (!this->useful) return;
  this->printScalars(message);
  for (HighsInt iCol = 0; iCol < HighsInt(this->col_status.size()); iCol++)
    printf("Basis: col_status[%2d] = %d\n", int(iCol),
           int(this->col_status[iCol]));
  for (HighsInt iRow = 0; iRow < HighsInt(this->row_status.size()); iRow++)
    printf("Basis: row_status[%2d] = %d\n", int(iRow),
           int(this->row_status[iRow]));
}